

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void fdct4x8_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char in_DL;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  __m128i __rounding_04;
  __m128i x4 [8];
  __m128i x3 [8];
  __m128i x2 [8];
  __m128i x1 [8];
  __m128i cospi_m40_p24;
  __m128i cospi_p24_p40;
  __m128i cospi_m08_p56;
  __m128i cospi_p56_p08;
  __m128i cospi_m16_p48;
  __m128i cospi_p48_p16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  __m128i __rounding;
  int32_t *cospi;
  __m128i *in_stack_fffffffffffff9c0;
  __m128i *in_stack_fffffffffffff9c8;
  longlong local_5f8;
  longlong lStack_5f0;
  longlong local_5e8;
  longlong lStack_5e0;
  longlong local_5d8;
  longlong lStack_5d0;
  longlong local_5c8;
  longlong lStack_5c0;
  __m128i *local_5b8;
  longlong lStack_5b0;
  longlong local_5a8;
  longlong lStack_5a0;
  longlong local_598;
  longlong lStack_590;
  longlong local_588;
  longlong lStack_580;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  longlong local_4e8;
  longlong lStack_4e0;
  longlong local_4d8;
  longlong lStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  longlong local_438;
  longlong lStack_430;
  longlong local_428;
  longlong lStack_420;
  longlong local_418;
  longlong lStack_410;
  longlong local_408;
  longlong lStack_400;
  longlong local_3f8;
  longlong lStack_3f0;
  longlong local_3e8;
  longlong lStack_3e0;
  longlong local_3d8;
  longlong lStack_3d0;
  longlong local_3c8;
  longlong lStack_3c0;
  longlong local_3b8;
  longlong lStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  int32_t *local_390;
  char local_381;
  undefined8 *local_380;
  undefined1 (*local_378) [16];
  uint local_370;
  uint local_36c;
  uint local_368;
  uint local_364;
  uint local_360;
  uint local_35c;
  int local_358;
  undefined4 local_354;
  uint local_350;
  int local_34c;
  longlong local_348;
  longlong lStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  longlong local_328;
  longlong lStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  longlong local_248;
  longlong lStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  longlong local_228;
  longlong lStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  longlong local_128;
  longlong lStack_120;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  longlong local_108;
  longlong lStack_100;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  longlong local_e8;
  longlong lStack_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  longlong local_c8;
  longlong lStack_c0;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  longlong local_a8;
  longlong lStack_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  longlong local_88;
  longlong lStack_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  longlong local_68;
  longlong lStack_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  longlong local_48;
  longlong lStack_40;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  longlong local_28;
  longlong lStack_20;
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_381 = in_DL;
  local_380 = in_RSI;
  local_378 = in_RDI;
  local_390 = cospi_arr((int)in_DL);
  local_34c = 1 << (local_381 - 1U & 0x1f);
  local_3a8 = CONCAT44(local_34c,local_34c);
  uStack_3a0 = CONCAT44(local_34c,local_34c);
  local_350 = -local_390[0x20] & 0xffffU | local_390[0x20] << 0x10;
  local_3b8 = CONCAT44(local_350,local_350);
  lStack_3b0 = CONCAT44(local_350,local_350);
  local_354 = CONCAT22((short)local_390[0x20],(short)local_390[0x20]);
  local_3c8 = CONCAT44(local_354,local_354);
  lStack_3c0 = CONCAT44(local_354,local_354);
  local_358 = (local_390[0x20] & 0xffffU) + local_390[0x20] * -0x10000;
  local_3d8 = CONCAT44(local_358,local_358);
  lStack_3d0 = CONCAT44(local_358,local_358);
  local_35c = (uint)*(ushort *)(local_390 + 0x30) | local_390[0x10] << 0x10;
  local_3e8 = CONCAT44(local_35c,local_35c);
  lStack_3e0 = CONCAT44(local_35c,local_35c);
  local_360 = -local_390[0x10] & 0xffffU | local_390[0x30] << 0x10;
  local_3f8 = CONCAT44(local_360,local_360);
  lStack_3f0 = CONCAT44(local_360,local_360);
  local_364 = (uint)*(ushort *)(local_390 + 0x38) | local_390[8] << 0x10;
  local_408 = CONCAT44(local_364,local_364);
  lStack_400 = CONCAT44(local_364,local_364);
  local_368 = -local_390[8] & 0xffffU | local_390[0x38] << 0x10;
  local_418 = CONCAT44(local_368,local_368);
  lStack_410 = CONCAT44(local_368,local_368);
  local_36c = (uint)*(ushort *)(local_390 + 0x18) | local_390[0x28] << 0x10;
  local_428 = CONCAT44(local_36c,local_36c);
  lStack_420 = CONCAT44(local_36c,local_36c);
  local_370 = -local_390[0x28] & 0xffffU | local_390[0x18] << 0x10;
  local_438 = CONCAT44(local_370,local_370);
  lStack_430 = CONCAT44(local_370,local_370);
  local_258 = *(undefined8 *)*local_378;
  uStack_250 = *(undefined8 *)(*local_378 + 8);
  local_268 = *(undefined8 *)local_378[7];
  uStack_260 = *(undefined8 *)(local_378[7] + 8);
  local_4b8 = paddsw(*local_378,local_378[7]);
  local_158 = *(undefined8 *)*local_378;
  uStack_150 = *(undefined8 *)(*local_378 + 8);
  local_168 = *(undefined8 *)local_378[7];
  uStack_160 = *(undefined8 *)(local_378[7] + 8);
  local_448 = psubsw(*local_378,local_378[7]);
  local_278 = *(undefined8 *)local_378[1];
  uStack_270 = *(undefined8 *)(local_378[1] + 8);
  local_288 = *(undefined8 *)local_378[6];
  uStack_280 = *(undefined8 *)(local_378[6] + 8);
  local_4a8 = paddsw(local_378[1],local_378[6]);
  local_178 = *(undefined8 *)local_378[1];
  uStack_170 = *(undefined8 *)(local_378[1] + 8);
  local_188 = *(undefined8 *)local_378[6];
  uStack_180 = *(undefined8 *)(local_378[6] + 8);
  local_458 = psubsw(local_378[1],local_378[6]);
  local_298 = *(undefined8 *)local_378[2];
  uStack_290 = *(undefined8 *)(local_378[2] + 8);
  local_2a8 = *(undefined8 *)local_378[5];
  uStack_2a0 = *(undefined8 *)(local_378[5] + 8);
  local_498 = paddsw(local_378[2],local_378[5]);
  local_198 = *(undefined8 *)local_378[2];
  uStack_190 = *(undefined8 *)(local_378[2] + 8);
  local_1a8 = *(undefined8 *)local_378[5];
  uStack_1a0 = *(undefined8 *)(local_378[5] + 8);
  local_468 = psubsw(local_378[2],local_378[5]);
  local_2b8 = *(undefined8 *)local_378[3];
  uStack_2b0 = *(undefined8 *)(local_378[3] + 8);
  local_2c8 = *(undefined8 *)local_378[4];
  uStack_2c0 = *(undefined8 *)(local_378[4] + 8);
  local_488 = paddsw(local_378[3],local_378[4]);
  local_1b8 = *(undefined8 *)local_378[3];
  uStack_1b0 = *(undefined8 *)(local_378[3] + 8);
  local_1c8 = *(undefined8 *)local_378[4];
  uStack_1c0 = *(undefined8 *)(local_378[4] + 8);
  local_478 = psubsw(local_378[3],local_378[4]);
  local_2d8 = local_4b8._0_8_;
  uStack_2d0 = local_4b8._8_8_;
  local_2e8 = local_488._0_8_;
  uStack_2e0 = local_488._8_8_;
  local_538 = paddsw(local_4b8,local_488);
  local_1d8 = local_4b8._0_8_;
  uStack_1d0 = local_4b8._8_8_;
  local_1e8 = local_488._0_8_;
  uStack_1e0 = local_488._8_8_;
  local_508 = psubsw(local_4b8,local_488);
  local_2f8 = local_4a8._0_8_;
  uStack_2f0 = local_4a8._8_8_;
  local_308 = local_498._0_8_;
  uStack_300 = local_498._8_8_;
  local_528 = paddsw(local_4a8,local_498);
  local_1f8 = local_4a8._0_8_;
  uStack_1f0 = local_4a8._8_8_;
  local_208 = local_498._0_8_;
  uStack_200 = local_498._8_8_;
  local_518 = psubsw(local_4a8,local_498);
  local_4f8 = local_478._0_8_;
  uStack_4f0 = local_478._8_8_;
  __rounding_00[1] = local_468;
  __rounding_00[0] = (ulong)(uint)(int)local_381;
  local_148 = local_3a8;
  uStack_140 = uStack_3a0;
  local_138 = local_34c;
  local_134 = local_34c;
  local_130 = local_34c;
  local_12c = local_34c;
  local_128 = local_3b8;
  lStack_120 = lStack_3b0;
  local_118 = local_350;
  local_114 = local_350;
  local_110 = local_350;
  local_10c = local_350;
  local_108 = local_3c8;
  lStack_100 = lStack_3c0;
  local_f8 = local_354;
  local_f4 = local_354;
  local_f0 = local_354;
  local_ec = local_354;
  local_e8 = local_3d8;
  lStack_e0 = lStack_3d0;
  local_d8 = local_358;
  local_d4 = local_358;
  local_d0 = local_358;
  local_cc = local_358;
  local_c8 = local_3e8;
  lStack_c0 = lStack_3e0;
  local_b8 = local_35c;
  local_b4 = local_35c;
  local_b0 = local_35c;
  local_ac = local_35c;
  local_a8 = local_3f8;
  lStack_a0 = lStack_3f0;
  local_98 = local_360;
  local_94 = local_360;
  local_90 = local_360;
  local_8c = local_360;
  local_88 = local_408;
  lStack_80 = lStack_400;
  local_78 = local_364;
  local_74 = local_364;
  local_70 = local_364;
  local_6c = local_364;
  local_68 = local_418;
  lStack_60 = lStack_410;
  local_58 = local_368;
  local_54 = local_368;
  local_50 = local_368;
  local_4c = local_368;
  local_48 = local_428;
  lStack_40 = lStack_420;
  local_38 = local_36c;
  local_34 = local_36c;
  local_30 = local_36c;
  local_2c = local_36c;
  local_28 = local_438;
  lStack_20 = lStack_430;
  local_10 = local_370;
  local_c = local_370;
  local_8 = local_370;
  local_4 = local_370;
  btf_16_w4_sse2((__m128i *)&local_3b8,(__m128i *)&local_3c8,__rounding_00,(char)local_4b8 + '`',
                 (__m128i *)&local_4e8,(__m128i *)&local_4d8,in_stack_fffffffffffff9c0,
                 in_stack_fffffffffffff9c8);
  local_4c8 = local_448._0_8_;
  uStack_4c0 = local_448._8_8_;
  __rounding_01[0] = (ulong)(uint)(int)local_381;
  __rounding_01[1] = (longlong)local_538;
  btf_16_w4_sse2((__m128i *)&local_3c8,(__m128i *)&local_3d8,__rounding_01,(char)local_538 + '\x10',
                 (__m128i *)&local_5b8,(__m128i *)&local_5a8,in_stack_fffffffffffff9c0,
                 in_stack_fffffffffffff9c8);
  __rounding_02[1] = local_518;
  __rounding_02[0] = (ulong)(uint)(int)local_381;
  btf_16_w4_sse2((__m128i *)&local_3e8,(__m128i *)&local_3f8,__rounding_02,(char)local_538 + '0',
                 (__m128i *)&local_598,(__m128i *)&local_588,in_stack_fffffffffffff9c0,
                 in_stack_fffffffffffff9c8);
  local_318 = local_4f8;
  uStack_310 = uStack_4f0;
  local_328 = local_4e8;
  lStack_320 = lStack_4e0;
  auVar4._8_8_ = uStack_4f0;
  auVar4._0_8_ = local_4f8;
  auVar3._8_8_ = lStack_4e0;
  auVar3._0_8_ = local_4e8;
  local_578 = paddsw(auVar4,auVar3);
  local_218 = local_4f8;
  uStack_210 = uStack_4f0;
  local_228 = local_4e8;
  lStack_220 = lStack_4e0;
  auVar8._8_8_ = uStack_4f0;
  auVar8._0_8_ = local_4f8;
  auVar7._8_8_ = lStack_4e0;
  auVar7._0_8_ = local_4e8;
  local_568 = psubsw(auVar8,auVar7);
  local_238 = local_4c8;
  uStack_230 = uStack_4c0;
  local_248 = local_4d8;
  lStack_240 = lStack_4d0;
  auVar6._8_8_ = uStack_4c0;
  auVar6._0_8_ = local_4c8;
  auVar5._8_8_ = lStack_4d0;
  auVar5._0_8_ = local_4d8;
  local_558 = psubsw(auVar6,auVar5);
  local_338 = local_4c8;
  uStack_330 = uStack_4c0;
  local_348 = local_4d8;
  lStack_340 = lStack_4d0;
  auVar2._8_8_ = uStack_4c0;
  auVar2._0_8_ = local_4c8;
  auVar1._8_8_ = lStack_4d0;
  auVar1._0_8_ = local_4d8;
  local_548 = paddsw(auVar2,auVar1);
  __rounding_03[1] = local_578;
  __rounding_03[0] = (ulong)(uint)(int)local_381;
  btf_16_w4_sse2((__m128i *)&local_408,(__m128i *)&local_418,__rounding_03,(char)&local_5b8 + 'p',
                 (__m128i *)&local_5f8,(__m128i *)&local_5c8,in_stack_fffffffffffff9c0,local_5b8);
  __rounding_04[1] = local_568;
  __rounding_04[0] = (ulong)(uint)(int)local_381;
  btf_16_w4_sse2((__m128i *)&local_428,(__m128i *)&local_438,__rounding_04,(char)&local_5b8 + '`',
                 (__m128i *)&local_5e8,(__m128i *)&local_5d8,in_stack_fffffffffffff9c0,local_5b8);
  *local_380 = local_5b8;
  local_380[1] = lStack_5b0;
  local_380[2] = local_5f8;
  local_380[3] = lStack_5f0;
  local_380[4] = local_598;
  local_380[5] = lStack_590;
  local_380[6] = local_5d8;
  local_380[7] = lStack_5d0;
  local_380[8] = local_5a8;
  local_380[9] = lStack_5a0;
  local_380[10] = local_5e8;
  local_380[0xb] = lStack_5e0;
  local_380[0xc] = local_588;
  local_380[0xd] = lStack_580;
  local_380[0xe] = local_5c8;
  local_380[0xf] = lStack_5c0;
  return;
}

Assistant:

static void fdct4x8_new_sse2(const __m128i *input, __m128i *output,
                             int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);

  // stage 1
  __m128i x1[8];
  x1[0] = _mm_adds_epi16(input[0], input[7]);
  x1[7] = _mm_subs_epi16(input[0], input[7]);
  x1[1] = _mm_adds_epi16(input[1], input[6]);
  x1[6] = _mm_subs_epi16(input[1], input[6]);
  x1[2] = _mm_adds_epi16(input[2], input[5]);
  x1[5] = _mm_subs_epi16(input[2], input[5]);
  x1[3] = _mm_adds_epi16(input[3], input[4]);
  x1[4] = _mm_subs_epi16(input[3], input[4]);

  // stage 2
  __m128i x2[8];
  x2[0] = _mm_adds_epi16(x1[0], x1[3]);
  x2[3] = _mm_subs_epi16(x1[0], x1[3]);
  x2[1] = _mm_adds_epi16(x1[1], x1[2]);
  x2[2] = _mm_subs_epi16(x1[1], x1[2]);
  x2[4] = x1[4];
  btf_16_w4_sse2(&cospi_m32_p32, &cospi_p32_p32, __rounding, cos_bit, &x1[5],
                 &x1[6], &x2[5], &x2[6]);
  x2[7] = x1[7];

  // stage 3
  __m128i x3[8];
  btf_16_w4_sse2(&cospi_p32_p32, &cospi_p32_m32, __rounding, cos_bit, &x2[0],
                 &x2[1], &x3[0], &x3[1]);
  btf_16_w4_sse2(&cospi_p48_p16, &cospi_m16_p48, __rounding, cos_bit, &x2[2],
                 &x2[3], &x3[2], &x3[3]);
  x3[4] = _mm_adds_epi16(x2[4], x2[5]);
  x3[5] = _mm_subs_epi16(x2[4], x2[5]);
  x3[6] = _mm_subs_epi16(x2[7], x2[6]);
  x3[7] = _mm_adds_epi16(x2[7], x2[6]);

  // stage 4
  __m128i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_w4_sse2(&cospi_p56_p08, &cospi_m08_p56, __rounding, cos_bit, &x3[4],
                 &x3[7], &x4[4], &x4[7]);
  btf_16_w4_sse2(&cospi_p24_p40, &cospi_m40_p24, __rounding, cos_bit, &x3[5],
                 &x3[6], &x4[5], &x4[6]);

  // stage 5
  output[0] = x4[0];
  output[1] = x4[4];
  output[2] = x4[2];
  output[3] = x4[6];
  output[4] = x4[1];
  output[5] = x4[5];
  output[6] = x4[3];
  output[7] = x4[7];
}